

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.c
# Opt level: O0

cio_error cio_init_uds_socket_address(cio_socket_address *sock_address,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  ulong local_30;
  size_t path_length;
  size_t max_path_length;
  char *path_local;
  cio_socket_address *sock_address_local;
  
  if (sock_address == (cio_socket_address *)0x0 || path == (char *)0x0) {
    sock_address_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    _Var1 = is_abstract_uds(path);
    if (_Var1) {
      sVar2 = strlen(path + 1);
    }
    else {
      sVar2 = strlen(path);
    }
    local_30 = sVar2 + 1;
    if (local_30 < 0x6d) {
      memset(&(sock_address->impl).sa,0,0x6e);
      (sock_address->impl).sa.socket_address.addr.sa_family = 1;
      memcpy((void *)((long)&(sock_address->impl).sa + 2),path,local_30);
      (sock_address->impl).len = (int)local_30 + 2;
      sock_address_local._4_4_ = CIO_SUCCESS;
    }
    else {
      sock_address_local._4_4_ = CIO_INVALID_ARGUMENT;
    }
  }
  return sock_address_local._4_4_;
}

Assistant:

cio_error cio_init_uds_socket_address(struct cio_socket_address *sock_address, const char *path)
{
	if (cio_unlikely((sock_address == NULL) || (path == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	size_t max_path_length = sizeof(sock_address->impl.sa.unix_address.un.sun_path);
	size_t path_length = 0;
	if (is_abstract_uds(path)) {
		path_length = strlen(path + 1) + 1;
	} else {
		path_length = strlen(path) + 1;
	}

	if (cio_unlikely(path_length > max_path_length)) {
		return CIO_INVALID_ARGUMENT;
	}

	memset(&sock_address->impl.sa.unix_address.un, 0x0, sizeof(sock_address->impl.sa.unix_address.un));
	sock_address->impl.sa.socket_address.addr.sa_family = (sa_family_t)CIO_ADDRESS_FAMILY_UNIX;
	memcpy(sock_address->impl.sa.unix_address.un.sun_path, path, path_length);
	sock_address->impl.len = (socklen_t)(offsetof(struct sockaddr_un, sun_path) + path_length);

	return CIO_SUCCESS;
}